

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  void *data_size;
  uint uVar14;
  char cVar15;
  bool bVar16;
  secp256k1_scalar non;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  int overflow;
  secp256k1_ge nonce_p;
  uchar nonce32 [32];
  secp256k1_scalar n;
  uchar tweak [32];
  int local_21c;
  secp256k1_scalar *local_218;
  uint local_20c;
  uint *local_208;
  secp256k1_context *local_200;
  secp256k1_scalar local_1f8;
  secp256k1_sha256 *local_1d0;
  secp256k1_ecdsa_s2c_opening *local_1c8;
  secp256k1_nonce_function local_1c0;
  secp256k1_scalar local_1b8;
  secp256k1_scalar local_198;
  secp256k1_gej local_178;
  secp256k1_ge local_f8;
  uchar local_98 [32];
  secp256k1_scalar local_78;
  uchar local_58 [40];
  
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  local_1c0 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_1c0 = noncefp;
  }
  local_218 = r;
  local_208 = (uint *)recid;
  local_200 = ctx;
  local_1d0 = s2c_sha;
  local_1c8 = s2c_opening;
  secp256k1_scalar_set_b32(&local_198,seckey,(int *)&local_178);
  local_20c = (uint)(((local_198.d[2] != 0 || local_198.d[3] != 0) ||
                     (local_198.d[1] != 0 || local_198.d[0] != 0)) && (int)local_178.x.n[0] == 0);
  uVar1 = (ulong)(local_20c ^ 1) - 1;
  local_198.d[0] = local_198.d[0] & uVar1 | (ulong)(local_20c ^ 1);
  local_198.d[1] = local_198.d[1] & uVar1;
  local_198.d[2] = local_198.d[2] & uVar1;
  local_198.d[3] = uVar1 & local_198.d[3];
  secp256k1_scalar_set_b32(&local_1b8,msg32,(int *)0x0);
  uVar13 = 0;
  do {
    data_size = noncedata;
    iVar10 = (*local_1c0)(local_98,msg32,seckey,(uchar *)0x0,noncedata,uVar13);
    bVar16 = iVar10 != 0;
    uVar14 = (uint)bVar16;
    cVar15 = '\x05';
    if (bVar16) {
      secp256k1_scalar_set_b32(&local_1f8,local_98,(int *)&local_178);
      uVar14 = (uint)bVar16;
      if (((int)local_178.x.n[0] == 0) &&
         (((local_1f8.d[1] != 0 || local_1f8.d[0] != 0) || local_1f8.d[2] != 0) ||
          local_1f8.d[3] != 0)) {
        if (s2c_data32 != (uchar *)0x0) {
          secp256k1_ecmult_gen(&local_200->ecmult_gen_ctx,&local_178,&local_1f8);
          secp256k1_ge_set_gej(&local_f8,&local_178);
          if (local_1c8 != (secp256k1_ecdsa_s2c_opening *)0x0) {
            secp256k1_pubkey_save((secp256k1_pubkey *)local_1c8,&local_f8);
          }
          iVar10 = secp256k1_ec_commit_tweak
                             (local_58,&local_f8,local_1d0,s2c_data32,(size_t)data_size);
          if (iVar10 == 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = secp256k1_ec_seckey_tweak_add_helper(&local_1f8,local_58);
          }
          if (iVar10 == 0) {
            cVar15 = (iVar10 == 0) * '\x05';
            uVar14 = 0;
            goto LAB_00114bf5;
          }
        }
        local_21c = 0;
        secp256k1_ecmult_gen(&local_200->ecmult_gen_ctx,&local_178,&local_1f8);
        secp256k1_ge_set_gej(&local_f8,&local_178);
        secp256k1_fe_normalize(&local_f8.x);
        secp256k1_fe_normalize(&local_f8.y);
        secp256k1_fe_get_b32(local_58,&local_f8.x);
        secp256k1_scalar_set_b32(local_218,local_58,&local_21c);
        puVar9 = local_208;
        if (local_208 != (uint *)0x0) {
          *local_208 = ((uint)local_f8.y.n[0] & 1) + local_21c * 2;
        }
        secp256k1_scalar_mul(&local_78,local_218,&local_198);
        secp256k1_scalar_add(&local_78,&local_78,&local_1b8);
        secp256k1_scalar_inverse(s,&local_1f8);
        secp256k1_scalar_mul(s,s,&local_78);
        local_78.d[2] = 0;
        local_78.d[3] = 0;
        local_78.d[0] = 0;
        local_78.d[1] = 0;
        local_178.x.n[0] = 0;
        local_178.x.n[1] = 0;
        local_178.x.n[2] = 0;
        local_178.x.n[3] = 0;
        local_178.x.n[4] = 0;
        local_178.y.n[0] = 0;
        local_178.y.n[1] = 0;
        local_178.y.n[2] = 0;
        local_178.y.n[3] = 0;
        local_178.y.n[4] = 0;
        local_178.z.n[0] = 0;
        local_178.z.n[1] = 0;
        local_178.z.n[2] = 0;
        local_178.z.n[3]._0_4_ = 0;
        local_178.z.n[3]._4_4_ = 0;
        local_178.z.n[4]._0_4_ = 0;
        local_178._116_8_ = 0;
        local_f8.x.n[0] = 0;
        local_f8.x.n[1] = 0;
        local_f8.x.n[2] = 0;
        local_f8.x.n[3] = 0;
        local_f8.x.n[4] = 0;
        local_f8.y.n[0] = 0;
        local_f8.y.n[1] = 0;
        local_f8.y.n[2] = 0;
        local_f8.y.n[3] = 0;
        local_f8.y.n[4] = 0;
        local_f8.infinity = 0;
        uVar11 = (uint)(s->d[3] >> 0x3f);
        uVar12 = uVar11 ^ 1;
        uVar14 = uVar12;
        if (s->d[2] == 0xffffffffffffffff) {
          uVar14 = 0;
        }
        if (0x5d576e7357a4501c < s->d[1]) {
          uVar12 = 0;
        }
        uVar12 = (uVar12 | uVar14 | s->d[3] < 0x7fffffffffffffff) ^ 1;
        uVar14 = 0;
        if (0xdfe92f46681b20a0 < s->d[0]) {
          uVar14 = uVar12;
        }
        if (0x5d576e7357a4501d < s->d[1]) {
          uVar14 = uVar12;
        }
        uVar14 = uVar14 | uVar11;
        secp256k1_scalar_cond_negate(s,uVar14);
        if (puVar9 != (uint *)0x0) {
          *puVar9 = *puVar9 ^ uVar14;
        }
        bVar3 = local_218->d[1] != 0;
        bVar4 = local_218->d[0] != 0;
        bVar2 = local_218->d[2] != 0;
        bVar16 = local_218->d[3] != 0;
        bVar7 = s->d[1] != 0;
        bVar8 = s->d[0] != 0;
        bVar6 = s->d[2] != 0;
        bVar5 = s->d[3] != 0;
        uVar14 = (uint)((((bVar7 || bVar8) || bVar6) || bVar5) &&
                       (((bVar3 || bVar4) || bVar2) || bVar16));
        cVar15 = '\x05';
        if ((((bVar7 || bVar8) || bVar6) || bVar5) && (((bVar3 || bVar4) || bVar2) || bVar16))
        goto LAB_00114bf5;
      }
      uVar13 = uVar13 + 1;
      cVar15 = '\0';
    }
LAB_00114bf5:
    if (cVar15 != '\0') {
      uVar13 = uVar14 & local_20c ^ 1;
      uVar1 = (ulong)uVar13 - 1;
      local_218->d[0] = local_218->d[0] & uVar1;
      local_218->d[1] = local_218->d[1] & uVar1;
      local_218->d[2] = local_218->d[2] & uVar1;
      local_218->d[3] = local_218->d[3] & uVar1;
      s->d[0] = s->d[0] & uVar1;
      s->d[1] = s->d[1] & uVar1;
      s->d[2] = s->d[2] & uVar1;
      s->d[3] = s->d[3] & uVar1;
      if (local_208 != (uint *)0x0) {
        *local_208 = uVar13 - 1 & *local_208;
      }
      return uVar14 & local_20c;
    }
  } while( true );
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}